

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

void CALCT(int *BOOL,int NN,double *SR,double *SI,double *HR,double *HI,double *QHR,double *QHI,
          double ARE,double INFINY,double *PVR,double *PVI,double *TR,double *TI)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dStack_68;
  int N;
  double pvit;
  double pvrt;
  double HVI;
  double HVR;
  double INFINY_local;
  double ARE_local;
  double *HI_local;
  double *HR_local;
  double *SI_local;
  double *SR_local;
  int *piStack_10;
  int NN_local;
  int *BOOL_local;
  
  HVR = INFINY;
  INFINY_local = ARE;
  ARE_local = (double)HI;
  HI_local = HR;
  HR_local = SI;
  SI_local = SR;
  SR_local._4_4_ = NN;
  piStack_10 = BOOL;
  POLYEV(NN + -1,SR,SI,HR,HI,QHR,QHI,&HVI,&pvrt);
  dVar1 = CMOD(&HVI,&pvrt);
  dVar2 = INFINY_local * 10.0;
  dVar3 = CMOD(HI_local + (NN + -2),(double *)((long)ARE_local + (long)(NN + -2) * 8));
  if (dVar2 * dVar3 < dVar1) {
    *piStack_10 = 0;
  }
  else {
    *piStack_10 = 1;
  }
  pvit = *PVR * -1.0;
  dStack_68 = *PVI * -1.0;
  if (*piStack_10 == 0) {
    CDIVID(&pvit,&stack0xffffffffffffff98,&HVI,&pvrt,HVR,TR,TI);
  }
  else {
    *TR = 0.0;
    *TI = 0.0;
  }
  return;
}

Assistant:

static void CALCT(int *BOOL, int NN, double *SR, double *SI, double *HR, double *HI,double *QHR, double *QHI,double ARE, double INFINY,double *PVR, double *PVI,double *TR, double *TI ) {
	/*
	C COMPUTES  T = -P(S)/H(S).
	C BOOL   - LOGICAL, SET TRUE IF H(S) IS ESSENTIALLY ZERO.
	*/
	double HVR, HVI, pvrt,pvit;
	int N;
	N = NN - 1;
	POLYEV(N, SR, SI, HR, HI, QHR, QHI, &HVR, &HVI);

	if (CMOD(&HVR, &HVI) <= ARE*10.0*CMOD(&HR[N - 1], &HI[N - 1])) {
		*BOOL = 1;
	}
	else {
		*BOOL = 0;
	}
	pvrt = -1.0 * *PVR;
	pvit = -1.0 * *PVI;
	if (*BOOL == 0) {
		CDIVID(&pvrt, &pvit, &HVR, &HVI, INFINY,TR, TI);
	}
	else {
		*TR = 0.0;
		*TI = 0.0;
	}

}